

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFParsingOptions.cpp
# Opt level: O0

PDFParsingOptions * PDFParsingOptions::DefaultPDFParsingOptions(void)

{
  int iVar1;
  allocator<char> local_29;
  string local_28;
  
  if (DefaultPDFParsingOptions()::pdf_parsing_options == '\0') {
    iVar1 = __cxa_guard_acquire(&DefaultPDFParsingOptions()::pdf_parsing_options);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"",&local_29);
      PDFParsingOptions(&DefaultPDFParsingOptions::pdf_parsing_options,&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::allocator<char>::~allocator(&local_29);
      __cxa_atexit(~PDFParsingOptions,&DefaultPDFParsingOptions::pdf_parsing_options,&__dso_handle);
      __cxa_guard_release(&DefaultPDFParsingOptions()::pdf_parsing_options);
    }
  }
  return &DefaultPDFParsingOptions::pdf_parsing_options;
}

Assistant:

const PDFParsingOptions& PDFParsingOptions::DefaultPDFParsingOptions(){
	static PDFParsingOptions pdf_parsing_options("");
	return pdf_parsing_options;
}